

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

string * __thiscall
re2::FormatMode_abi_cxx11_(string *__return_storage_ptr__,re2 *this,ParseFlags flags)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  
  if (parse_modes == (int)this) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,DAT_0015a438,DAT_0015a440 + DAT_0015a438);
  }
  else {
    uVar4 = 0xffffffffffffffff;
    plVar2 = &DAT_0015a438;
    do {
      plVar3 = plVar2;
      if (uVar4 == 3) goto LAB_0011de21;
      uVar4 = uVar4 + 1;
      plVar2 = plVar3 + 5;
    } while ((int)plVar3[4] != (int)this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar1 = plVar3[5];
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar1,plVar3[6] + lVar1);
    if (3 < uVar4) {
LAB_0011de21:
      StringPrintf_abi_cxx11_(__return_storage_ptr__,"%#x",(ulong)this & 0xffffffff);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string FormatMode(Regexp::ParseFlags flags) {
  for (int i = 0; i < arraysize(parse_modes); i++)
    if (parse_modes[i].parse_flags == flags)
      return parse_modes[i].desc;
  return StringPrintf("%#x", static_cast<uint>(flags));
}